

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O3

void lin_reg<float,float>
               (vector<float,_std::allocator<float>_> *x,vector<float,_std::allocator<float>_> *y,
               double *coeff,double *intercept,size_t start,size_t end)

{
  long lVar1;
  pointer pfVar2;
  pointer pfVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  
  pfVar2 = (y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar4 = (long)(y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar2;
  pfVar3 = (x->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (lVar4 != (long)(x->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pfVar3) {
    __assert_fail("y.size() == x.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vrunge[P]slopeOP/src/linalg.h"
                  ,0x2c,
                  "void lin_reg(vector<T1> &, vector<T2> &, double *, double *, size_t, size_t) [T1 = float, T2 = float]"
                 );
  }
  if (end <= (ulong)(lVar4 >> 2)) {
    dVar7 = 0.0;
    dVar6 = 0.0;
    dVar8 = 0.0;
    dVar9 = 0.0;
    lVar4 = end - start;
    if (lVar4 != 0) {
      lVar5 = start * 4;
      lVar1 = end * 4;
      do {
        dVar6 = dVar6 + (double)(*(float *)((long)pfVar3 + lVar5) * *(float *)((long)pfVar3 + lVar5)
                                );
        lVar5 = lVar5 + 4;
      } while (lVar1 - lVar5 != 0);
      lVar5 = start * 4;
      dVar8 = 0.0;
      do {
        dVar8 = dVar8 + (double)*(float *)((long)pfVar3 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar1 - lVar5 != 0);
      dVar7 = 0.0;
      if (end == start) {
        dVar9 = 0.0;
      }
      else {
        lVar5 = start * 4;
        do {
          dVar7 = dVar7 + (double)*(float *)((long)pfVar2 + lVar5);
          lVar5 = lVar5 + 4;
        } while (lVar1 - lVar5 != 0);
        dVar9 = 0.0;
        if (end != start) {
          lVar5 = start << 2;
          do {
            dVar9 = dVar9 + (double)(*(float *)((long)pfVar3 + lVar5) *
                                    *(float *)((long)pfVar2 + lVar5));
            lVar5 = lVar5 + 4;
          } while (lVar1 - lVar5 != 0);
        }
      }
    }
    auVar11._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar11._0_8_ = lVar4;
    auVar11._12_4_ = 0x45300000;
    dVar12 = (auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
    dVar10 = dVar12 * dVar6 - dVar8 * dVar8;
    *intercept = (dVar6 / dVar10) * dVar7 + (-dVar8 / dVar10) * dVar9;
    *coeff = (-dVar8 / dVar10) * dVar7 + (dVar12 / dVar10) * dVar9;
    return;
  }
  __assert_fail("start >= 0 && end <= x.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vrunge[P]slopeOP/src/linalg.h"
                ,0x2d,
                "void lin_reg(vector<T1> &, vector<T2> &, double *, double *, size_t, size_t) [T1 = float, T2 = float]"
               );
}

Assistant:

void lin_reg(vector<T1> &x, vector<T2> &y, double *coeff, double *intercept,
             size_t start, size_t end) {
  /* calculate LSLR on x,y from position start to end (excluded). */

  assert(y.size() == x.size());
  assert(start >= 0 && end <= x.size());

  double m00, m11, m01, det;
  double i00, i11, i01;

  m00 = end - start;
  m11 =
      inner_product(x.begin() + start, x.begin() + end, x.begin() + start, 0.0);
  m01 = accumulate(x.begin() + start, x.begin() + end, 0.0);

  det = (m00 * m11) - m01 * m01;

  i00 = m11 / det;
  i11 = m00 / det;
  i01 = -m01 / det;

  double v1 = accumulate(y.begin() + start, y.begin() + end, 0.0);
  double v2 =
      inner_product(x.begin() + start, x.begin() + end, y.begin() + start, 0.0);

  *intercept = i00 * v1 + i01 * v2;
  *coeff = i01 * v1 + i11 * v2;
}